

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool glslang::OutputSpvBin
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,char *baseName)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  value_type local_22c;
  int local_228;
  uint word;
  int i;
  ofstream out;
  char *baseName_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  
  std::ofstream::ofstream(&i);
  std::operator|(_S_bin,_S_out);
  std::ofstream::open((char *)&i,(_Ios_Openmode)baseName);
  uVar2 = std::ios::fail();
  if ((uVar2 & 1) == 0) {
    local_228 = 0;
    while( true ) {
      iVar1 = local_228;
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
      if ((int)sVar3 <= iVar1) break;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (spirv,(long)local_228);
      local_22c = *pvVar4;
      std::ostream::write((char *)&i,(long)&local_22c);
      local_228 = local_228 + 1;
    }
    std::ofstream::close();
    spirv_local._7_1_ = true;
  }
  else {
    printf("ERROR: Failed to open file: %s\n",baseName);
    spirv_local._7_1_ = false;
  }
  word = 1;
  std::ofstream::~ofstream(&i);
  return spirv_local._7_1_;
}

Assistant:

bool OutputSpvBin(const std::vector<unsigned int>& spirv, const char* baseName)
{
    std::ofstream out;
    out.open(baseName, std::ios::binary | std::ios::out);
    if (out.fail()) {
        printf("ERROR: Failed to open file: %s\n", baseName);
        return false;
    }
    for (int i = 0; i < (int)spirv.size(); ++i) {
        unsigned int word = spirv[i];
        out.write((const char*)&word, 4);
    }
    out.close();
    return true;
}